

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::
       fill<kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                 (char *target,CappedArray<char,_5UL> *first,ArrayPtr<const_char> *rest,
                 CappedArray<char,_5UL> *rest_1,ArrayPtr<const_char> *rest_2,
                 CappedArray<char,_5UL> *rest_3,ArrayPtr<const_char> *rest_4,
                 ArrayPtr<const_char> *rest_5)

{
  char *pcVar1;
  ArrayPtr<const_char> *first_00;
  CappedArray<char,_5UL> *rest_00;
  ArrayPtr<const_char> *rest_1_00;
  CappedArray<char,_5UL> *rest_2_00;
  ArrayPtr<const_char> *rest_3_00;
  ArrayPtr<const_char> *rest_4_00;
  char *end;
  char *i;
  CappedArray<char,_5UL> *rest_local_3;
  ArrayPtr<const_char> *rest_local_2;
  CappedArray<char,_5UL> *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  CappedArray<char,_5UL> *first_local;
  char *target_local;
  
  end = CappedArray<char,_5UL>::begin(first);
  pcVar1 = CappedArray<char,_5UL>::end(first);
  first_local = (CappedArray<char,_5UL> *)target;
  while (end != pcVar1) {
    *(char *)&first_local->currentSize = *end;
    end = end + 1;
    first_local = (CappedArray<char,_5UL> *)((long)&first_local->currentSize + 1);
  }
  first_00 = fwd<kj::ArrayPtr<char_const>>(rest);
  rest_00 = fwd<kj::CappedArray<char,5ul>>(rest_1);
  rest_1_00 = fwd<kj::ArrayPtr<char_const>>(rest_2);
  rest_2_00 = fwd<kj::CappedArray<char,5ul>>(rest_3);
  rest_3_00 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  rest_4_00 = fwd<kj::ArrayPtr<char_const>>(rest_5);
  pcVar1 = fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                     ((char *)first_local,first_00,rest_00,rest_1_00,rest_2_00,rest_3_00,rest_4_00);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}